

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
gtl::
dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
::dense_hashtable(dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                  *this,size_type expected_max_items_in_table,ShapeEdgeIdHash *hf,
                 equal_to<s2shapeutil::ShapeEdgeId> *eql,Identity *ext,SetKey *set,
                 allocator<s2shapeutil::ShapeEdgeId> *alloc)

{
  SetKey *sk;
  SetKey *ek;
  Identity *eq;
  size_type num_buckets;
  size_type local_90;
  allocator<s2shapeutil::ShapeEdgeId> local_39;
  SetKey *local_38;
  SetKey *set_local;
  Identity *ext_local;
  equal_to<s2shapeutil::ShapeEdgeId> *eql_local;
  ShapeEdgeIdHash *hf_local;
  size_type expected_max_items_in_table_local;
  dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  *this_local;
  
  local_38 = set;
  set_local = (SetKey *)ext;
  ext_local = (Identity *)eql;
  eql_local = (equal_to<s2shapeutil::ShapeEdgeId> *)hf;
  hf_local = (ShapeEdgeIdHash *)expected_max_items_in_table;
  expected_max_items_in_table_local = (size_type)this;
  Settings::Settings(&this->settings,hf);
  eq = ext_local;
  ek = set_local;
  sk = local_38;
  std::allocator<s2shapeutil::ShapeEdgeId>::allocator(&local_39,alloc);
  KeyInfo::KeyInfo(&this->key_info,(Identity *)ek,sk,(equal_to<s2shapeutil::ShapeEdgeId> *)eq,
                   &local_39);
  std::allocator<s2shapeutil::ShapeEdgeId>::~allocator(&local_39);
  this->num_deleted = 0;
  this->num_elements = 0;
  if (hf_local == (ShapeEdgeIdHash *)0x0) {
    local_90 = 0x20;
  }
  else {
    local_90 = sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
               ::min_buckets((sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
                              *)this,(size_type)hf_local,0);
  }
  this->num_buckets = local_90;
  this->table = (pointer)0x0;
  num_buckets = bucket_count(this);
  sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
                    *)this,num_buckets);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql, value_alloc_type(alloc)),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        table(nullptr) {
    // table is nullptr until the empty key is set. However, we set num_buckets
    // here so we know how much space to allocate once the empty key is set.
    settings.reset_thresholds(bucket_count());
  }